

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::UpdateBuffer
          (DeviceContextVkImpl *this,IBuffer *pBuffer,Uint64 Offset,Uint64 Size,void *pData,
          RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  BufferDesc *pBVar1;
  Char *Message;
  unsigned_long __n;
  undefined1 local_98 [8];
  VulkanUploadAllocation TmpSpace;
  size_t Alignment;
  undefined1 local_60 [8];
  string msg;
  BufferVkImpl *pBuffVk;
  RESOURCE_STATE_TRANSITION_MODE StateTransitionMode_local;
  void *pData_local;
  Uint64 Size_local;
  Uint64 Offset_local;
  IBuffer *pBuffer_local;
  DeviceContextVkImpl *this_local;
  
  pData_local = (void *)Size;
  Size_local = Offset;
  Offset_local = (Uint64)pBuffer;
  pBuffer_local = (IBuffer *)this;
  DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateBuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pBuffer,Offset,Size,pData,
             StateTransitionMode);
  msg.field_2._8_8_ =
       ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)Offset_local);
  pBVar1 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                      *)msg.field_2._8_8_);
  if (pBVar1->Usage == USAGE_DYNAMIC) {
    FormatString<char[42]>
              ((string *)local_60,(char (*) [42])"Dynamic buffers must be updated via Map()");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x844);
    std::__cxx11::string::~string((string *)local_60);
  }
  TmpSpace.AlignedOffset = 4;
  VulkanUploadHeap::Allocate
            ((VulkanUploadAllocation *)local_98,&this->m_UploadHeap,(VkDeviceSize)pData_local,4);
  __n = StaticCast<unsigned_long,unsigned_long>((unsigned_long *)&pData_local);
  memcpy(TmpSpace.vkBuffer,pData,__n);
  UpdateBufferRegion(this,(BufferVkImpl *)msg.field_2._8_8_,Size_local,(Uint64)pData_local,
                     (VkBuffer)local_98,TmpSpace.Size,StateTransitionMode);
  return;
}

Assistant:

void DeviceContextVkImpl::UpdateBuffer(IBuffer*                       pBuffer,
                                       Uint64                         Offset,
                                       Uint64                         Size,
                                       const void*                    pData,
                                       RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    TDeviceContextBase::UpdateBuffer(pBuffer, Offset, Size, pData, StateTransitionMode);

    // We must use cmd context from the device context provided, otherwise there will
    // be resource barrier issues in the cmd list in the device context
    BufferVkImpl* pBuffVk = ClassPtrCast<BufferVkImpl>(pBuffer);

    DEV_CHECK_ERR(pBuffVk->GetDesc().Usage != USAGE_DYNAMIC, "Dynamic buffers must be updated via Map()");

    constexpr size_t Alignment = 4;
    // Source buffer offset must be multiple of 4 (18.4)
    VulkanUploadAllocation TmpSpace = m_UploadHeap.Allocate(Size, Alignment);
    memcpy(TmpSpace.CPUAddress, pData, StaticCast<size_t>(Size));
    UpdateBufferRegion(pBuffVk, Offset, Size, TmpSpace.vkBuffer, TmpSpace.AlignedOffset, StateTransitionMode);
    // The allocation will stay in the upload heap until the end of the frame at which point all upload
    // pages will be discarded
}